

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<128>,Blob<224>>(pfHash hash,int reps,bool verbose)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  int b;
  uint32_t uVar5;
  uint32_t uVar6;
  void *__s;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int keybit;
  ulong uVar11;
  uint32_t bit;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined8 in_XMM7_Qb;
  Blob<224> d;
  Blob<128> key;
  Blob<224> h2;
  Blob<224> h1;
  uint local_104;
  uint local_f4;
  long local_e8;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  Rand local_88;
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined1 auStack_68 [12];
  undefined4 uStack_5c;
  undefined1 local_58 [12];
  undefined4 uStack_4c;
  undefined1 auStack_48 [12];
  undefined4 uStack_3c;
  undefined1 auVar20 [32];
  
  local_88.x = 0x88e23b73;
  local_88.y = 0x11310f6c;
  local_88.z = 0x18847f4;
  local_88.w = 0x1142a2ba;
  local_98 = (undefined1  [16])0x0;
  auStack_48 = SUB1612((undefined1  [16])0x0,4);
  local_58 = SUB1612((undefined1  [16])0x0,0);
  uStack_4c = 0;
  auStack_68 = SUB1612((undefined1  [16])0x0,4);
  local_78 = SUB1612((undefined1  [16])0x0,0);
  uStack_6c = 0;
  __s = operator_new(0x6200000);
  lVar14 = 0;
  memset(__s,0,0x6200000);
  local_e8 = (long)__s + 0x10;
  do {
    bit = (uint32_t)lVar14;
    if ((bit * -0x55555555 >> 2 | bit * -0x40000000) < 0x15555556) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_88,local_98,0x10);
        (*hash)(local_98,0x10,0,local_58);
        flipbit(local_98,0x10,bit);
        (*hash)(local_98,0x10,0,local_78);
        auVar4._12_4_ = uStack_4c;
        auVar4._0_12_ = local_58;
        auVar4._16_12_ = auStack_48;
        auVar4._28_4_ = uStack_3c;
        auVar19 = vmovdqu8_avx512vl(auVar4);
        auVar20._0_28_ = auVar19._0_28_;
        auVar20._30_2_ = auVar19._30_2_;
        auVar20._28_2_ = 0;
        auVar19._12_4_ = uStack_6c;
        auVar19._0_12_ = local_78;
        auVar19._16_12_ = auStack_68;
        auVar19._28_4_ = uStack_5c;
        auVar19 = vmovdqu8_avx512vl(auVar19);
        auVar21._0_28_ = auVar19._0_28_;
        auVar21._30_2_ = auVar19._30_2_;
        auVar21._28_2_ = 0;
        local_b8 = vmovdqu8_avx512vl(auVar21 ^ auVar20);
        lVar12 = -0xdf;
        lVar9 = local_e8;
        lVar18 = 0;
        do {
          lVar1 = lVar18 + 1;
          lVar13 = lVar12;
          lVar17 = lVar9;
          do {
            uVar5 = getbit(local_b8,0x1c,(uint32_t)lVar18);
            uVar6 = getbit(local_b8,0x1c,(int)lVar13 + 0xe0);
            piVar3 = (int *)(lVar17 + (ulong)(uVar6 * 2 | uVar5) * 4);
            *piVar3 = *piVar3 + 1;
            lVar17 = lVar17 + 0x10;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0);
          lVar9 = lVar9 + 0xe10;
          lVar12 = lVar12 + 1;
          lVar18 = lVar1;
        } while (lVar1 != 0xdf);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    lVar14 = lVar14 + 1;
    local_e8 = local_e8 + 0xc4000;
  } while (lVar14 != 0x80);
  putchar(10);
  lVar14 = (long)__s + 0x10;
  auVar22 = ZEXT864(0) << 0x40;
  uVar7 = 1;
  auVar26 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar27 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar28 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar15 = 0;
  local_104 = 0;
  local_f4 = 0;
  uVar8 = 0;
  do {
    uVar2 = uVar8 + 1;
    uVar16 = uVar7;
    lVar9 = lVar14;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar8 & 0xffffffff,uVar16 & 0xffffffff);
        auVar28 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar27 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar26 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar22 = ZEXT864(auVar22._0_8_);
      }
      uVar11 = 0;
      lVar18 = lVar9;
      do {
        auVar25 = ZEXT864(0) << 0x40;
        lVar12 = 0;
        do {
          auVar23._0_8_ = (double)*(int *)(lVar18 + lVar12 * 4) / (double)(reps / 2);
          auVar23._8_8_ = in_XMM7_Qb;
          auVar23 = vfmadd213sd_fma(auVar23,auVar26._0_16_,auVar27._0_16_);
          auVar23 = vandpd_avx(auVar23,auVar28._0_16_);
          auVar23 = vmaxsd_avx(auVar23,auVar25._0_16_);
          auVar25 = ZEXT1664(auVar23);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        dVar24 = auVar23._0_8_;
        if (auVar22._0_8_ < dVar24) {
          uVar15 = uVar11 & 0xffffffff;
          auVar22 = ZEXT1664(auVar23);
          local_104 = (uint)uVar8;
          local_f4 = (uint)uVar16;
        }
        if (verbose) {
          iVar10 = 0x2e;
          if ((0.01 <= dVar24) && (iVar10 = 0x6f, 0.05 <= dVar24)) {
            iVar10 = (uint)(0.33 <= dVar24) * 9 + 0x4f;
          }
          putchar(iVar10);
          auVar22 = ZEXT864(auVar22._0_8_);
          auVar26 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar27 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar28 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar11 = uVar11 + 1;
        lVar18 = lVar18 + 0xc4000;
      } while (uVar11 != 0x80);
      if (verbose) {
        putchar(10);
        auVar28 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar27 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar26 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar22 = ZEXT864(auVar22._0_8_);
      }
      uVar16 = uVar16 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar16 != 0xe0);
    if (verbose) {
      iVar10 = 0x8c;
      do {
        putchar(0x2d);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      putchar(10);
      auVar22 = ZEXT864(auVar22._0_8_);
      auVar26 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar27 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar28 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar7 = uVar7 + 1;
    lVar14 = lVar14 + 0xe10;
    uVar8 = uVar2;
  } while (uVar2 != 0xdf);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar15,(ulong)local_104,(ulong)local_f4);
  operator_delete(__s);
  return auVar22._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}